

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int import_tls13_traffic_protection(ptls_t *tls,int is_enc,uint8_t **src,uint8_t *end)

{
  int iVar1;
  int iVar2;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *__dest;
  uint64_t *value;
  
  __dest = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    __dest = &tls->traffic_protection;
  }
  memcpy(__dest,*src,tls->cipher_suite->hash->digest_size);
  *src = *src + tls->cipher_suite->hash->digest_size;
  value = &(__dest->dec).seq;
  iVar1 = ptls_decode64(value,src,end);
  iVar2 = 0x32;
  if (iVar1 == 0) {
    iVar1 = setup_traffic_protection(tls,is_enc,(char *)0x0,3,*value,0);
    iVar2 = 0x204;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int import_tls13_traffic_protection(ptls_t *tls, int is_enc, const uint8_t **src, const uint8_t *const end)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    /* set properties */
    memcpy(tp->secret, *src, tls->cipher_suite->hash->digest_size);
    *src += tls->cipher_suite->hash->digest_size;
    if (ptls_decode64(&tp->seq, src, end) != 0)
        return PTLS_ALERT_DECODE_ERROR;

    if (setup_traffic_protection(tls, is_enc, NULL, 3, tp->seq, 0) != 0)
        return PTLS_ERROR_INCOMPATIBLE_KEY;

    return 0;
}